

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVIMaker.cpp
# Opt level: O2

VideoStream * __thiscall AVIMaker::getVideoStreamByID(AVIMaker *this,uint32_t stream_id)

{
  pointer ppVVar1;
  VideoStream *pVVar2;
  int i;
  long lVar3;
  
  ppVVar1 = (this->videoStreams).super__Vector_base<VideoStream_*,_std::allocator<VideoStream_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = 0;
  do {
    if ((long)(this->videoStreams).super__Vector_base<VideoStream_*,_std::allocator<VideoStream_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3 == lVar3) {
      if (this->isTrace == true) {
        printf("getVideoStreamByID failed. id = %d");
        return (VideoStream *)0x0;
      }
      return (VideoStream *)0x0;
    }
    pVVar2 = ppVVar1[lVar3];
    lVar3 = lVar3 + 1;
  } while (pVVar2->m_streamID != (ulong)stream_id);
  return pVVar2;
}

Assistant:

VideoStream *AVIMaker::getVideoStreamByID(uint32_t stream_id) {
    for (int i = 0; i < this->videoStreams.size(); i++) {
        if (this->videoStreams[i]->getStreamID() == stream_id) return this->videoStreams[i];
    }
    TRACE printf("getVideoStreamByID failed. id = %d", stream_id);
    return nullptr;
}